

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void EMIT_OP(CodeGenGenericContext *ctx,x86Command op)

{
  x86Instruction *pxVar1;
  
  switch(op) {
  case o_none:
    break;
  case o_mov:
  case o_movsx:
  case o_push:
  case o_pop:
  case o_lea:
switchD_001c9a71_caseD_1:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x328,"void EMIT_OP(CodeGenGenericContext &, x86Command)");
  case o_cdq:
  case o_cqo:
    ctx->genRegRead[1] = true;
    CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,rEDX);
    break;
  case o_rep_movsd:
    if (ctx->genReg[3].type != argNumber) {
      __assert_fail("ctx.genReg[rECX].type == x86Argument::argNumber",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x308,"void EMIT_OP(CodeGenGenericContext &, x86Command)");
    }
    CodeGenGenericContext::InvalidateState(ctx);
    ctx->genRegRead[3] = true;
    ctx->genRegRead[8] = true;
    goto LAB_001c9a93;
  case o_rep_stosb:
  case o_rep_stosw:
  case o_rep_stosd:
  case o_rep_stosq:
    if (ctx->genReg[3].type != argNumber) {
      __assert_fail("ctx.genReg[rECX].type == x86Argument::argNumber",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x315,"void EMIT_OP(CodeGenGenericContext &, x86Command)");
    }
    CodeGenGenericContext::InvalidateState(ctx);
    ctx->genRegRead[3] = true;
    ctx->genRegRead[1] = true;
LAB_001c9a93:
    ctx->genRegRead[6] = true;
    break;
  default:
    if ((op != o_other) && (op != o_use32)) {
      if (op != o_ret) goto switchD_001c9a71_caseD_1;
      ctx->genRegRead[1] = true;
      ctx->genRegRead[4] = true;
      CodeGenGenericContext::KillUnreadRegisters(ctx);
      CodeGenGenericContext::InvalidateState(ctx);
    }
  }
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argNone;
  (pxVar1->argB).type = argNone;
  ctx->x86Op = pxVar1 + 1;
  return;
}

Assistant:

void EMIT_OP(CodeGenGenericContext &ctx, x86Command op)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_none:
		break;
	case o_ret:
		// Mark return registers as implicitly used
		ctx.ReadRegister(rEAX);
		ctx.ReadRegister(rEDX);

		ctx.KillUnreadRegisters();

		ctx.InvalidateState();
		break;
	case o_rep_movsd:
		assert(ctx.genReg[rECX].type == x86Argument::argNumber);

		ctx.InvalidateState();

		// Implicit register reads
		ctx.ReadRegister(rECX);
		ctx.ReadRegister(rESI);
		ctx.ReadRegister(rEDI);
		break;
	case o_rep_stosb:
	case o_rep_stosw:
	case o_rep_stosd:
	case o_rep_stosq:
		assert(ctx.genReg[rECX].type == x86Argument::argNumber);

		ctx.InvalidateState();

		// Implicit register reads
		ctx.ReadRegister(rECX);
		ctx.ReadRegister(rEAX);
		ctx.ReadRegister(rEDI);
		break;
	case o_cdq:
	case o_cqo:
		ctx.ReadRegister(rEAX);

		ctx.OverwriteRegisterWithUnknown(rEDX);
		break;
	case o_use32:
	case o_other:
		break;
	default:
		assert(!"unknown instruction");
	}
#else
	if(op == o_ret)
		ctx.InvalidateState();
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argNone;
	ctx.x86Op->argB.type = x86Argument::argNone;
	ctx.x86Op++;
}